

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteBlock.cpp
# Opt level: O0

ByteBlock *
Js::ByteBlock::New(Recycler *alloc,byte *initialContent,int initialContentSize,
                  ScriptContext *requestContext)

{
  uchar *puVar1;
  code *pcVar2;
  byte *pbVar3;
  bool bVar4;
  undefined4 *puVar5;
  Recycler *alloc_00;
  ByteBlock *this;
  uchar **ppuVar6;
  ulong uVar7;
  Var pvVar8;
  ulong local_88;
  size_t i;
  size_t count;
  Var *dst;
  Var *src;
  TrackAllocData local_58;
  ByteBlock *local_30;
  ByteBlock *newBlock;
  ScriptContext *requestContext_local;
  byte *pbStack_18;
  int initialContentSize_local;
  byte *initialContent_local;
  Recycler *alloc_local;
  
  newBlock = (ByteBlock *)requestContext;
  requestContext_local._4_4_ = initialContentSize;
  pbStack_18 = initialContent;
  initialContent_local = (byte *)alloc;
  if (initialContentSize < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteBlock.cpp"
                                ,0x4f,"(initialContentSize > 0)","Must have valid data size");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pbVar3 = initialContent_local;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteBlock.cpp"
             ,0x51);
  alloc_00 = Memory::Recycler::TrackAllocInfo((Recycler *)pbVar3,&local_58);
  this = (ByteBlock *)new<Memory::Recycler>(0x10,alloc_00,0x43c4b0);
  ByteBlock(this,requestContext_local._4_4_,(Recycler *)initialContent_local);
  pbVar3 = pbStack_18;
  local_30 = this;
  if (pbStack_18 != (byte *)0x0) {
    ppuVar6 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                        ((WriteBarrierPtr *)&this->m_content);
    puVar1 = *ppuVar6;
    uVar7 = (ulong)(int)requestContext_local._4_4_;
    for (local_88 = 0; local_88 < uVar7 >> 3; local_88 = local_88 + 1) {
      bVar4 = TaggedInt::Is(*(Var *)(pbVar3 + local_88 * 8));
      if (bVar4) {
        *(undefined8 *)(puVar1 + local_88 * 8) = *(undefined8 *)(pbVar3 + local_88 * 8);
      }
      else {
        bVar4 = JavascriptNumber::Is(*(Var *)(pbVar3 + local_88 * 8));
        if (!bVar4) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteBlock.cpp"
                                      ,0x6d,"(JavascriptNumber::Is(src[i]))",
                                      "JavascriptNumber::Is(src[i])");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        pvVar8 = JavascriptNumber::CloneToScriptContext
                           (*(Var *)(pbVar3 + local_88 * 8),(ScriptContext *)newBlock);
        *(Var *)(puVar1 + local_88 * 8) = pvVar8;
        ScriptContext::BindReference((ScriptContext *)newBlock,*(void **)(puVar1 + local_88 * 8));
      }
    }
  }
  return local_30;
}

Assistant:

ByteBlock *ByteBlock::New(Recycler *alloc, const byte * initialContent, int initialContentSize, ScriptContext * requestContext)
    {
        // initialContent may be 'null' if no data to copy
        AssertMsg(initialContentSize > 0, "Must have valid data size");

        ByteBlock *newBlock = RecyclerNew(alloc, ByteBlock, initialContentSize, alloc);

        //
        // Copy any optional data into the block:
        // - If initialContent was not provided, the block's contents will be uninitialized.
        //
        if (initialContent != nullptr)
        {
            //
            // Treat initialContent as array of vars
            // Clone vars to the requestContext
            //

            Var *src = (Var*)initialContent;
            Var *dst = (Var*)(byte*)newBlock->m_content;
            size_t count = initialContentSize / sizeof(Var);

            for (size_t i = 0; i < count; i++)
            {
                if (TaggedInt::Is(src[i]))
                {
                    dst[i] = src[i];
                }
                else
                {
                    //
                    // Currently only numbers are put into AuxiliaryContext data
                    //
                    Assert(JavascriptNumber::Is(src[i]));
                    dst[i] = JavascriptNumber::CloneToScriptContext(src[i], requestContext);
                    requestContext->BindReference(dst[i]);
                }
            }
        }

        return newBlock;
    }